

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::dequantize_from_int32(Mat *src,Mat *dst,Mat *scale_data,Mat *bias_data,Option *opt)

{
  int *piVar1;
  Layer *pLVar2;
  void **ppvVar3;
  void **in_RCX;
  void **in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  Mat weights [2];
  ParamDict pd;
  Layer *dequantize;
  ParamDict *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  Mat *in_stack_fffffffffffffdb8;
  ParamDict *in_stack_fffffffffffffdc0;
  void **ppvVar4;
  void **local_228;
  void **local_1d8;
  undefined1 local_1c8 [16];
  void *local_1b8;
  int *local_1b0;
  void *local_1a8;
  undefined4 local_1a0;
  long *local_198;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  void *local_178;
  void *local_170;
  int *local_168;
  void *local_160;
  undefined4 local_158;
  long *local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  void *local_130;
  void *apvStack_128 [2];
  ParamDict local_118;
  Layer *local_108;
  undefined8 local_100;
  void **local_f8;
  void **local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  void **local_d8;
  void **local_c8;
  int local_b8;
  undefined4 local_b4;
  void **local_b0;
  void **local_a8;
  void **local_a0;
  int local_98;
  undefined4 local_94;
  void **local_90;
  void **local_88;
  void **local_80;
  int local_78;
  undefined4 local_74;
  void **local_70;
  int local_68;
  undefined4 local_64;
  void **local_60;
  int local_48;
  undefined4 local_44;
  void **local_40;
  void *local_20;
  
  local_100 = in_R8;
  local_f8 = in_RCX;
  local_f0 = in_RDX;
  local_e8 = in_RSI;
  local_e0 = in_RDI;
  local_108 = create_layer(in_stack_fffffffffffffdac);
  ParamDict::ParamDict(in_stack_fffffffffffffdc0);
  ParamDict::set(&local_118,0,*(int *)((long)local_f0 + 0x2c));
  ParamDict::set(&local_118,1,*(int *)((long)local_f8 + 0x2c));
  (*local_108->_vptr_Layer[2])(local_108,&local_118);
  local_1d8 = &local_1b8;
  do {
    local_d8 = local_1d8;
    *local_1d8 = (void *)0x0;
    local_1d8[1] = (void *)0x0;
    local_1d8[2] = (void *)0x0;
    *(undefined4 *)(local_1d8 + 3) = 0;
    local_1d8[4] = (void *)0x0;
    *(undefined4 *)(local_1d8 + 5) = 0;
    *(undefined4 *)((long)local_1d8 + 0x2c) = 0;
    *(undefined4 *)(local_1d8 + 6) = 0;
    *(undefined4 *)((long)local_1d8 + 0x34) = 0;
    *(undefined4 *)(local_1d8 + 7) = 0;
    local_1d8[8] = (void *)0x0;
    local_1d8 = local_1d8 + 9;
  } while (local_1d8 != apvStack_128);
  local_90 = local_f0;
  local_88 = &local_1b8;
  if (&local_1b8 != local_f0) {
    if (local_f0[1] != (void *)0x0) {
      piVar1 = (int *)local_f0[1];
      local_94 = 1;
      LOCK();
      local_98 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_70 = &local_1b8;
    if (local_1b0 != (int *)0x0) {
      local_74 = 0xffffffff;
      LOCK();
      local_78 = *local_1b0;
      *local_1b0 = *local_1b0 + -1;
      UNLOCK();
      if (local_78 == 1) {
        if (local_198 == (long *)0x0) {
          if (local_1b8 != (void *)0x0) {
            free(local_1b8);
          }
        }
        else {
          (**(code **)(*local_198 + 0x18))(local_198,local_1b8);
        }
      }
    }
    local_1b8 = *local_90;
    local_1b0 = (int *)local_90[1];
    local_1a8 = local_90[2];
    local_1a0 = *(undefined4 *)(local_90 + 3);
    local_198 = (long *)local_90[4];
    local_190 = *(undefined4 *)(local_90 + 5);
    local_18c = *(undefined4 *)((long)local_90 + 0x2c);
    local_188 = *(undefined4 *)(local_90 + 6);
    local_184 = *(undefined4 *)((long)local_90 + 0x34);
    local_180 = *(undefined4 *)(local_90 + 7);
    local_178 = local_90[8];
  }
  local_b0 = local_f8;
  local_a8 = &local_170;
  local_80 = &local_1b8;
  if (&local_170 != local_f8) {
    if (local_f8[1] != (void *)0x0) {
      piVar1 = (int *)local_f8[1];
      local_b4 = 1;
      LOCK();
      local_b8 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_60 = &local_170;
    if (local_168 != (int *)0x0) {
      local_64 = 0xffffffff;
      LOCK();
      local_68 = *local_168;
      *local_168 = *local_168 + -1;
      UNLOCK();
      if (local_68 == 1) {
        if (local_150 == (long *)0x0) {
          if (local_170 != (void *)0x0) {
            free(local_170);
          }
        }
        else {
          (**(code **)(*local_150 + 0x18))(local_150,local_170);
        }
      }
    }
    local_170 = *local_b0;
    local_168 = (int *)local_b0[1];
    local_160 = local_b0[2];
    local_158 = *(undefined4 *)(local_b0 + 3);
    local_150 = (long *)local_b0[4];
    local_148 = *(undefined4 *)(local_b0 + 5);
    local_144 = *(undefined4 *)((long)local_b0 + 0x2c);
    local_140 = *(undefined4 *)(local_b0 + 6);
    local_13c = *(undefined4 *)((long)local_b0 + 0x34);
    local_138 = *(undefined4 *)(local_b0 + 7);
    local_130 = local_b0[8];
  }
  pLVar2 = local_108;
  local_a0 = &local_170;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  (*pLVar2->_vptr_Layer[3])(pLVar2,local_1c8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffda0);
  (*local_108->_vptr_Layer[4])(local_108,local_100);
  (*local_108->_vptr_Layer[7])(local_108,local_e0,local_e8,local_100);
  (*local_108->_vptr_Layer[5])(local_108,local_100);
  if (local_108 != (Layer *)0x0) {
    (*local_108->_vptr_Layer[1])();
  }
  local_228 = apvStack_128;
  do {
    ppvVar3 = local_228 + -9;
    ppvVar4 = ppvVar3;
    local_c8 = ppvVar3;
    local_40 = ppvVar3;
    if (local_228[-8] != (void *)0x0) {
      piVar1 = (int *)local_228[-8];
      local_44 = 0xffffffff;
      LOCK();
      local_48 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_48 == 1) {
        if (local_228[-5] == (void *)0x0) {
          local_20 = *ppvVar3;
          if (local_20 != (void *)0x0) {
            free(local_20);
          }
        }
        else {
          (**(code **)(*local_228[-5] + 0x18))(local_228[-5],*ppvVar3);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    local_228[-7] = (void *)0x0;
    *(undefined4 *)(local_228 + -6) = 0;
    *(undefined4 *)(local_228 + -4) = 0;
    *(undefined4 *)((long)local_228 + -0x1c) = 0;
    *(undefined4 *)(local_228 + -3) = 0;
    *(undefined4 *)((long)local_228 + -0x14) = 0;
    *(undefined4 *)(local_228 + -2) = 0;
    local_228[-1] = (void *)0x0;
    local_228[-8] = (void *)0x0;
    local_228 = ppvVar4;
  } while (ppvVar4 != &local_1b8);
  ParamDict::~ParamDict(in_stack_fffffffffffffda0);
  return;
}

Assistant:

void dequantize_from_int32(const Mat& src, Mat& dst, const Mat& scale_data, const Mat& bias_data, const Option& opt)
{
    Layer* dequantize = create_layer(LayerType::Dequantize);

    ParamDict pd;
    pd.set(0, scale_data.w);
    pd.set(1, bias_data.w);

    dequantize->load_param(pd);

    Mat weights[2];
    weights[0] = scale_data;
    weights[1] = bias_data;

    dequantize->load_model(ModelBinFromMatArray(weights));

    dequantize->create_pipeline(opt);

    dequantize->forward(src, dst, opt);

    dequantize->destroy_pipeline(opt);

    delete dequantize;
}